

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsDQJtimes(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,N_Vector v,N_Vector Jv,
                 sunrealtype c_j,void *ida_mem,N_Vector work1,N_Vector work2)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  SUNLinearSolver_ID LSID;
  int retval;
  int iter;
  sunrealtype siginv;
  sunrealtype sig;
  N_Vector yp_tmp;
  N_Vector y_tmp;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_80;
  int local_7c;
  double local_70;
  long local_58;
  long local_50;
  int local_4;
  
  local_4 = idaLs_AccessLMem((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             (IDALsMem *)0x11b4b2);
  if (local_4 == 0) {
    iVar1 = SUNLinSolGetID(*(undefined8 *)(local_58 + 0x20));
    if ((iVar1 == 8) || (iVar1 == 7)) {
      local_70 = *(double *)(local_58 + 0x70) * *(double *)(local_58 + 0x78);
    }
    else {
      local_70 = *(double *)(local_58 + 0x78);
      dVar2 = (double)N_VWrmsNorm(in_RCX,*(undefined8 *)(local_50 + 0x180));
      local_70 = local_70 / dVar2;
    }
    local_80 = 0;
    for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
      N_VLinearSum(local_70,0x3ff0000000000000,in_RCX,in_RDI,in_stack_00000008);
      N_VLinearSum(in_XMM1_Qa * local_70,0x3ff0000000000000,in_RCX,in_RSI,in_stack_00000010);
      local_80 = (**(code **)(local_58 + 0x138))
                           (in_XMM0_Qa,in_stack_00000008,in_stack_00000010,in_R8,
                            *(undefined8 *)(local_50 + 0x18));
      *(long *)(local_58 + 0xa8) = *(long *)(local_58 + 0xa8) + 1;
      if (local_80 == 0) break;
      if (local_80 < 0) {
        return -1;
      }
      local_70 = local_70 * 0.25;
    }
    if (local_80 < 1) {
      N_VLinearSum(1.0 / local_70,-(1.0 / local_70),in_R8,in_RDX,in_R8);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int idaLsDQJtimes(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector rr,
                  N_Vector v, N_Vector Jv, sunrealtype c_j, void* ida_mem,
                  N_Vector work1, N_Vector work2)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  N_Vector y_tmp, yp_tmp;
  sunrealtype sig, siginv;
  int iter, retval;
  SUNLinearSolver_ID LSID;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  LSID = SUNLinSolGetID(idals_mem->LS);
  if (LSID == SUNLINEARSOLVER_SPGMR || LSID == SUNLINEARSOLVER_SPFGMR)
  {
    sig = idals_mem->nrmfac * idals_mem->dqincfac;
  }
  else { sig = idals_mem->dqincfac / N_VWrmsNorm(v, IDA_mem->ida_ewt); }

  /* Rename work1 and work2 for readibility */
  y_tmp  = work1;
  yp_tmp = work2;

  for (iter = 0; iter < MAX_ITERS; iter++)
  {
    /* Set y_tmp = yy + sig*v, yp_tmp = yp + cj*sig*v. */
    N_VLinearSum(sig, v, ONE, yy, y_tmp);
    N_VLinearSum(c_j * sig, v, ONE, yp, yp_tmp);

    /* Call res for Jv = F(t, y_tmp, yp_tmp), and return if it failed. */
    retval = idals_mem->jt_res(tt, y_tmp, yp_tmp, Jv, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    sig *= PT25;
  }

  if (retval > 0) { return (+1); }

  /* Set Jv to [Jv - rr]/sig and return. */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, rr, Jv);

  return (0);
}